

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgroupbox.cpp
# Opt level: O0

void QGroupBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QGroupBox *_t;
  QString *in_stack_ffffffffffffff68;
  QGroupBox *in_stack_ffffffffffffff70;
  QGroupBox *in_stack_ffffffffffffff78;
  QGroupBox *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 b;
  QGroupBoxPrivate *in_stack_ffffffffffffff90;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> *pQVar4;
  
  b = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff80 = (QGroupBox *)(ulong)in_EDX;
    bVar2 = SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0);
    switch(in_stack_ffffffffffffff80) {
    case (QGroupBox *)0x0:
      clicked((QGroupBox *)0x5a5986,bVar2);
      break;
    case (QGroupBox *)0x1:
      clicked((QGroupBox *)0x5a5994,bVar2);
      break;
    case (QGroupBox *)0x2:
      toggled((QGroupBox *)0x5a59b0,bVar2);
      break;
    case (QGroupBox *)0x3:
      setChecked(in_stack_ffffffffffffff80,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
      break;
    case (QGroupBox *)0x4:
      d_func((QGroupBox *)0x5a59d8);
      QGroupBoxPrivate::_q_setChildrenEnabled(in_stack_ffffffffffffff90,(bool)b);
    }
  }
  if ((in_ESI != 5) ||
     ((bVar2 = QtMocHelpers::indexOfMethod<void(QGroupBox::*)(bool)>(in_RCX,(void **)clicked,0,0),
      !bVar2 && (bVar2 = QtMocHelpers::indexOfMethod<void(QGroupBox::*)(bool)>
                                   (in_RCX,(void **)toggled,0,2), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar4 = *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> **)in_RCX;
      in_stack_ffffffffffffff78 = (QGroupBox *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff78) {
      case (QGroupBox *)0x0:
        title(in_stack_ffffffffffffff78);
        QString::operator=((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        QString::~QString((QString *)0x5a5ad7);
        break;
      case (QGroupBox *)0x1:
        QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)alignment(in_stack_ffffffffffffff70);
        pQVar4->super_QFlagsStorage<Qt::AlignmentFlag> =
             QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i;
        break;
      case (QGroupBox *)0x2:
        bVar2 = isFlat(in_stack_ffffffffffffff70);
        *(bool *)&pQVar4->super_QFlagsStorage<Qt::AlignmentFlag> = bVar2;
        break;
      case (QGroupBox *)0x3:
        bVar2 = isCheckable(in_stack_ffffffffffffff70);
        *(bool *)&pQVar4->super_QFlagsStorage<Qt::AlignmentFlag> = bVar2;
        break;
      case (QGroupBox *)0x4:
        bVar2 = isChecked(in_stack_ffffffffffffff70);
        *(bool *)&pQVar4->super_QFlagsStorage<Qt::AlignmentFlag> = bVar2;
      }
    }
    if (in_ESI == 2) {
      bVar2 = SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0);
      switch(in_EDX) {
      case 0:
        setTitle(in_stack_ffffffffffffff80,(QString *)in_stack_ffffffffffffff78);
        break;
      case 1:
        ::QFlags::operator_cast_to_unsigned_int(*(QFlags **)in_RCX);
        setAlignment(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        break;
      case 2:
        setFlat(in_stack_ffffffffffffff80,bVar2);
        break;
      case 3:
        setCheckable(in_stack_ffffffffffffff80,bVar2);
        break;
      case 4:
        setChecked(in_stack_ffffffffffffff80,bVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGroupBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGroupBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->clicked(); break;
        case 2: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->d_func()->_q_setChildrenEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::toggled, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 2: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}